

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O3

Status __thiscall
soplex::SPxSolverBase<double>::getPrimalSol
          (SPxSolverBase<double> *this,VectorBase<double> *p_vector)

{
  Status *pSVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  DataKey DVar5;
  int iVar6;
  Status SVar7;
  long lVar8;
  SVSetBase<double> *pSVar9;
  undefined8 *puVar10;
  long lVar11;
  pointer pdVar12;
  double dVar13;
  DataKey local_60;
  long local_58;
  undefined1 local_50 [16];
  double local_40;
  DataKey local_38;
  
  if (this->initialized == false) {
    SVar7 = status(this);
    if (SVar7 == NO_PROBLEM) {
      SVar7 = status(this);
      return SVar7;
    }
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_60 = (DataKey)local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"XSOLVE06 Not Initialized","");
    *puVar10 = &PTR__SPxException_003adbd8;
    puVar10[1] = puVar10 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar10 + 1),local_60,(undefined1 *)(local_58 + (long)local_60));
    *puVar10 = &PTR__SPxException_003aea68;
    __cxa_throw(puVar10,&SPxStatusException::typeinfo,SPxException::~SPxException);
  }
  if (this->theRep == ROW) {
    VectorBase<double>::operator=(p_vector,&this->theCoPvec->super_VectorBase<double>);
  }
  else {
    lVar8 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>
                  .set.thenum;
    if (0 < lVar8) {
      pSVar1 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
      pdVar2 = (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar4 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar11 = 0;
      do {
        pdVar12 = pdVar3;
        switch(pSVar1[lVar11]) {
        case D_FREE:
        case D_ON_UPPER:
        case D_ON_LOWER:
        case D_ON_BOTH:
        case D_UNDEFINED:
          goto switchD_001deb28_caseD_1;
        case P_FIXED:
        case P_ON_UPPER:
          pdVar12 = pdVar4;
        case P_ON_LOWER:
          dVar13 = pdVar12[lVar11];
          break;
        default:
          puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_60 = (DataKey)local_50;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_60,"XSOLVE07 This should never happen.","");
          *puVar10 = &PTR__SPxException_003adbd8;
          puVar10[1] = puVar10 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar10 + 1),local_60,(undefined1 *)(local_58 + (long)local_60));
          *puVar10 = &PTR__SPxException_003ae9a0;
          __cxa_throw(puVar10,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        case P_FREE:
          dVar13 = 0.0;
        }
        pdVar2[lVar11] = dVar13;
switchD_001deb28_caseD_1:
        lVar11 = lVar11 + 1;
      } while (lVar8 != lVar11);
    }
    pSVar9 = this->thecovectors;
    if (0 < (pSVar9->set).thenum) {
      lVar8 = 0;
      do {
        DVar5 = (this->super_SPxBasisBase<double>).theBaseId.data[lVar8].super_DataKey;
        if (0 < DVar5.info) {
          local_40 = (this->theFvec->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8];
          local_38 = DVar5;
          SPxColId::SPxColId((SPxColId *)&local_60,(SPxId *)&local_38);
          iVar6 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                            (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                              super_SVSetBase<double>.set,&local_60);
          (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar6] = local_40;
          pSVar9 = this->thecovectors;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (pSVar9->set).thenum);
    }
  }
  SVar7 = status(this);
  return SVar7;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getPrimalSol(VectorBase<R>& p_vector) const
{

   if(!isInitialized())
   {
      /* exit if presolving/simplifier cleared the problem */
      if(status() == NO_PROBLEM)
         return status();

      throw SPxStatusException("XSOLVE06 Not Initialized");
   }

   if(rep() == ROW)
      p_vector = coPvec();
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nCols(); ++i)
      {
         switch(ds.colStatus(i))
         {
         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            p_vector[i] = SPxLPBase<R>::lower(i);
            break;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::P_FIXED :
            p_vector[i] = SPxLPBase<R>::upper(i);
            break;

         case SPxBasisBase<R>::Desc::P_FREE :
            p_vector[i] = 0;
            break;

         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_BOTH :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
            break;

         default:
            throw SPxInternalCodeException("XSOLVE07 This should never happen.");
         }
      }

      for(int j = 0; j < dim(); ++j)
      {
         if(this->baseId(j).isSPxColId())
            p_vector[ this->number(SPxColId(this->baseId(j))) ] = fVec()[j];
      }
   }

   return status();
}